

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::SingleVertexArrayUsageGroup::SingleVertexArrayUsageGroup
          (SingleVertexArrayUsageGroup *this,Context *context,Usage usage)

{
  Usage usage_00;
  string local_60;
  string local_40;
  
  deqp::gls::Array::usageTypeToString_abi_cxx11_(&local_40,(Array *)(ulong)usage,usage);
  deqp::gls::Array::usageTypeToString_abi_cxx11_(&local_60,(Array *)(ulong)usage,usage_00);
  TestCaseGroup::TestCaseGroup
            (&this->super_TestCaseGroup,context,local_40._M_dataplus._M_p,local_60._M_dataplus._M_p)
  ;
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SingleVertexArrayUsageGroup_01e31978;
  this->m_usage = usage;
  return;
}

Assistant:

SingleVertexArrayUsageGroup::SingleVertexArrayUsageGroup (Context& context, Array::Usage usage)
	: TestCaseGroup	(context, Array::usageTypeToString(usage).c_str(), Array::usageTypeToString(usage).c_str())
	, m_usage		(usage)
{
}